

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

bool __thiscall TypeInfo::testInBuiltTypesOnAttributes(TypeInfo *this,bool DTDPresent)

{
  wchar16 wVar1;
  wchar16 wVar2;
  short sVar3;
  short sVar4;
  DOMElement *pDVar5;
  long *plVar6;
  wchar16 *pwVar7;
  wchar16 *pwVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  long *plVar13;
  short *psVar14;
  XMLCh *pXVar15;
  short *psVar16;
  undefined1 uVar17;
  XStr local_40;
  XStr local_38;
  
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar5 = findElement(this,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar7 == local_40.fUnicodeForm) {
LAB_00103508:
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_38.fUnicodeForm) {
      pwVar8 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_0010358b;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_0010358b:
            tmp = *pwVar8 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar7;
          if (wVar1 == L'\0') goto LAB_0010358b;
          pwVar7 = pwVar7 + 1;
          wVar2 = *pwVar8;
          pwVar8 = pwVar8 + 1;
        } while (wVar1 == wVar2);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar8 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00103508;
LAB_001034f6:
        wVar1 = *pwVar8;
      }
      else {
        wVar1 = *pwVar7;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001034f6;
      }
      if (wVar1 == L'\0') goto LAB_00103508;
    }
    else {
      do {
        wVar1 = *pwVar7;
        if (wVar1 == L'\0') goto LAB_001034f6;
        pwVar7 = pwVar7 + 1;
        wVar2 = *pwVar8;
        pwVar8 = pwVar8 + 1;
      } while (wVar1 == wVar2);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  uVar17 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010375f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010375f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00103806:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00103806;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("anySimpleType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE) {
LAB_001038dd:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010392c;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00103923;
      }
LAB_0010392c:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00103bba;
      goto LAB_0010393d;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE;
    if (psVar14 == (short *)0x0) {
LAB_001038d7:
      if (*psVar16 == 0) goto LAB_001038dd;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001038d7;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00103923:
    tmp = false;
LAB_0010393d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00103aaa:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00103aaa;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00103b5d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00103b5d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00103bba:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING) {
LAB_00103c37:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00103c86;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00103c7d;
      }
LAB_00103c86:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00103f14;
      goto LAB_00103c97;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING;
    if (psVar14 == (short *)0x0) {
LAB_00103c31:
      if (*psVar16 == 0) goto LAB_00103c37;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00103c31;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00103c7d:
    tmp = false;
LAB_00103c97:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00103e04:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00103e04;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00103eb7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00103eb7;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00103f14:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("boolean",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN) {
LAB_00103f91:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00103fe0;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00103fd7;
      }
LAB_00103fe0:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010426e;
      goto LAB_00103ff1;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN;
    if (psVar14 == (short *)0x0) {
LAB_00103f8b:
      if (*psVar16 == 0) goto LAB_00103f91;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00103f8b;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00103fd7:
    tmp = false;
LAB_00103ff1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xab);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010415e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010415e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104211:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104211;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010426e:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL) {
LAB_001042eb:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010433a;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00104331;
      }
LAB_0010433a:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001045c8;
      goto LAB_0010434b;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL;
    if (psVar14 == (short *)0x0) {
LAB_001042e5:
      if (*psVar16 == 0) goto LAB_001042eb;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001042e5;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00104331:
    tmp = false;
LAB_0010434b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xae);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001044b8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001044b8;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010456b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010456b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001045c8:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("float",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT) {
LAB_00104645:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00104694;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010468b;
      }
LAB_00104694:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00104922;
      goto LAB_001046a5;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT;
    if (psVar14 == (short *)0x0) {
LAB_0010463f:
      if (*psVar16 == 0) goto LAB_00104645;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010463f;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010468b:
    tmp = false;
LAB_001046a5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104812:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104812;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001048c5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001048c5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00104922:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("double",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE) {
LAB_0010499f:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001049ee;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001049e5;
      }
LAB_001049ee:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00104c7c;
      goto LAB_001049ff;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE;
    if (psVar14 == (short *)0x0) {
LAB_00104999:
      if (*psVar16 == 0) goto LAB_0010499f;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00104999;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001049e5:
    tmp = false;
LAB_001049ff:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104b6c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104b6c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104c1f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104c1f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00104c7c:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("duration",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION) {
LAB_00104cf9:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00104d48;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00104d3f;
      }
LAB_00104d48:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00104fd6;
      goto LAB_00104d59;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION;
    if (psVar14 == (short *)0x0) {
LAB_00104cf3:
      if (*psVar16 == 0) goto LAB_00104cf9;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00104cf3;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00104d3f:
    tmp = false;
LAB_00104d59:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104ec6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104ec6;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00104f79:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00104f79;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00104fd6:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("dateTime",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME) {
LAB_00105053:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001050a2;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00105099;
      }
LAB_001050a2:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00105330;
      goto LAB_001050b3;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME;
    if (psVar14 == (short *)0x0) {
LAB_0010504d:
      if (*psVar16 == 0) goto LAB_00105053;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010504d;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00105099:
    tmp = false;
LAB_001050b3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00105220:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00105220;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001052d3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001052d3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00105330:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("time",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_TIME) {
LAB_001053ad:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001053fc;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001053f3;
      }
LAB_001053fc:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010568a;
      goto LAB_0010540d;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_TIME;
    if (psVar14 == (short *)0x0) {
LAB_001053a7:
      if (*psVar16 == 0) goto LAB_001053ad;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001053a7;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001053f3:
    tmp = false;
LAB_0010540d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010557a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010557a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010562d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010562d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010568a:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("date",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATE) {
LAB_00105707:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00105756;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010574d;
      }
LAB_00105756:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001059e4;
      goto LAB_00105767;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATE;
    if (psVar14 == (short *)0x0) {
LAB_00105701:
      if (*psVar16 == 0) goto LAB_00105707;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00105701;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010574d:
    tmp = false;
LAB_00105767:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001058d4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001058d4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00105987:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00105987;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001059e4:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gYearMonth",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH) {
LAB_00105a61:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00105ab0;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00105aa7;
      }
LAB_00105ab0:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00105d3e;
      goto LAB_00105ac1;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH;
    if (psVar14 == (short *)0x0) {
LAB_00105a5b:
      if (*psVar16 == 0) goto LAB_00105a61;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00105a5b;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00105aa7:
    tmp = false;
LAB_00105ac1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00105c2e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00105c2e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00105ce1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00105ce1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00105d3e:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gYear",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR) {
LAB_00105dbb:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00105e0a;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00105e01;
      }
LAB_00105e0a:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00106098;
      goto LAB_00105e1b;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR;
    if (psVar14 == (short *)0x0) {
LAB_00105db5:
      if (*psVar16 == 0) goto LAB_00105dbb;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00105db5;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00105e01:
    tmp = false;
LAB_00105e1b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00105f88:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00105f88;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010603b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010603b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00106098:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gMonthDay",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY) {
LAB_00106115:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00106164;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010615b;
      }
LAB_00106164:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001063f2;
      goto LAB_00106175;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY;
    if (psVar14 == (short *)0x0) {
LAB_0010610f:
      if (*psVar16 == 0) goto LAB_00106115;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010610f;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010615b:
    tmp = false;
LAB_00106175:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001062e2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001062e2;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00106395:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00106395;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001063f2:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gDay",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DAY) {
LAB_0010646f:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001064be;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001064b5;
      }
LAB_001064be:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010674c;
      goto LAB_001064cf;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DAY;
    if (psVar14 == (short *)0x0) {
LAB_00106469:
      if (*psVar16 == 0) goto LAB_0010646f;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00106469;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001064b5:
    tmp = false;
LAB_001064cf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010663c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010663c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001066ef:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001066ef;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010674c:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gMonth",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH) {
LAB_001067c9:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00106818;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010680f;
      }
LAB_00106818:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00106aa6;
      goto LAB_00106829;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH;
    if (psVar14 == (short *)0x0) {
LAB_001067c3:
      if (*psVar16 == 0) goto LAB_001067c9;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001067c3;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010680f:
    tmp = false;
LAB_00106829:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00106996:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00106996;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00106a49:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00106a49;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00106aa6:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("hexBinary",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY) {
LAB_00106b23:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00106b72;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00106b69;
      }
LAB_00106b72:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00106e00;
      goto LAB_00106b83;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY;
    if (psVar14 == (short *)0x0) {
LAB_00106b1d:
      if (*psVar16 == 0) goto LAB_00106b23;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00106b1d;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00106b69:
    tmp = false;
LAB_00106b83:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00106cf0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00106cf0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00106da3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00106da3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00106e00:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("base64Binary",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY) {
LAB_00106e7d:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00106ecc;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00106ec3;
      }
LAB_00106ecc:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010715a;
      goto LAB_00106edd;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY;
    if (psVar14 == (short *)0x0) {
LAB_00106e77:
      if (*psVar16 == 0) goto LAB_00106e7d;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00106e77;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00106ec3:
    tmp = false;
LAB_00106edd:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010704a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010704a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001070fd:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001070fd;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010715a:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("anyURI",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_001071d7:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00107226;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010721d;
      }
LAB_00107226:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001074b4;
      goto LAB_00107237;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar14 == (short *)0x0) {
LAB_001071d1:
      if (*psVar16 == 0) goto LAB_001071d7;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001071d1;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010721d:
    tmp = false;
LAB_00107237:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001073a4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001073a4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00107457:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00107457;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001074b4:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("QName",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME) {
LAB_00107531:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00107580;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00107577;
      }
LAB_00107580:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010780e;
      goto LAB_00107591;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME;
    if (psVar14 == (short *)0x0) {
LAB_0010752b:
      if (*psVar16 == 0) goto LAB_00107531;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010752b;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00107577:
    tmp = false;
LAB_00107591:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001076fe:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001076fe;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001077b1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001077b1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010780e:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("normalizedString",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING) {
LAB_0010788b:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001078da;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001078d1;
      }
LAB_001078da:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00107b68;
      goto LAB_001078eb;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING;
    if (psVar14 == (short *)0x0) {
LAB_00107885:
      if (*psVar16 == 0) goto LAB_0010788b;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00107885;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001078d1:
    tmp = false;
LAB_001078eb:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xde);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00107a58:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00107a58;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00107b0b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00107b0b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00107b68:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("token",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN) {
LAB_00107be5:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00107c34;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00107c2b;
      }
LAB_00107c34:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00107ec2;
      goto LAB_00107c45;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN;
    if (psVar14 == (short *)0x0) {
LAB_00107bdf:
      if (*psVar16 == 0) goto LAB_00107be5;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00107bdf;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00107c2b:
    tmp = false;
LAB_00107c45:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00107db2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00107db2;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00107e65:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00107e65;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00107ec2:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("language",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE) {
LAB_00107f3f:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00107f8e;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00107f85;
      }
LAB_00107f8e:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010821c;
      goto LAB_00107f9f;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE;
    if (psVar14 == (short *)0x0) {
LAB_00107f39:
      if (*psVar16 == 0) goto LAB_00107f3f;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00107f39;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00107f85:
    tmp = false;
LAB_00107f9f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010810c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010810c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001081bf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001081bf;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010821c:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NMTOKEN",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgNmTokenString) {
LAB_00108299:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001082e8;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001082df;
      }
LAB_001082e8:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00108576;
      goto LAB_001082f9;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::XMLUni::fgNmTokenString;
    if (psVar14 == (short *)0x0) {
LAB_00108293:
      if (*psVar16 == 0) goto LAB_00108299;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00108293;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001082df:
    tmp = false;
LAB_001082f9:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108466:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108466;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108519:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108519;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00108576:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NMTOKENS",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgNmTokensString) {
LAB_001085f3:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00108642;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00108639;
      }
LAB_00108642:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001088d0;
      goto LAB_00108653;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::XMLUni::fgNmTokensString;
    if (psVar14 == (short *)0x0) {
LAB_001085ed:
      if (*psVar16 == 0) goto LAB_001085f3;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001085ed;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00108639:
    tmp = false;
LAB_00108653:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001087c0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001087c0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108873:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108873;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001088d0:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("Name",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NAME) {
LAB_0010894d:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010899c;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00108993;
      }
LAB_0010899c:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00108c2a;
      goto LAB_001089ad;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NAME;
    if (psVar14 == (short *)0x0) {
LAB_00108947:
      if (*psVar16 == 0) goto LAB_0010894d;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00108947;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00108993:
    tmp = false;
LAB_001089ad:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xed);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108b1a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108b1a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108bcd:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108bcd;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00108c2a:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NCName",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME) {
LAB_00108ca7:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00108cf6;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00108ced;
      }
LAB_00108cf6:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00108f84;
      goto LAB_00108d07;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME;
    if (psVar14 == (short *)0x0) {
LAB_00108ca1:
      if (*psVar16 == 0) goto LAB_00108ca7;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00108ca1;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00108ced:
    tmp = false;
LAB_00108d07:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108e74:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108e74;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00108f27:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00108f27;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00108f84:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("ID",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgIDString) {
LAB_00109001:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00109050;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00109047;
      }
LAB_00109050:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_001092de;
      goto LAB_00109061;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::XMLUni::fgIDString;
    if (psVar14 == (short *)0x0) {
LAB_00108ffb:
      if (*psVar16 == 0) goto LAB_00109001;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00108ffb;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_00109047:
    tmp = false;
LAB_00109061:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001091ce:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001091ce;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109281:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109281;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_001092de:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("IDREF",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgIDRefString) {
LAB_0010935b:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_001093aa;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001093a1;
      }
LAB_001093aa:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00109638;
      goto LAB_001093bb;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::XMLUni::fgIDRefString;
    if (psVar14 == (short *)0x0) {
LAB_00109355:
      if (*psVar16 == 0) goto LAB_0010935b;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_00109355;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001093a1:
    tmp = false;
LAB_001093bb:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109528:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109528;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001095db:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001095db;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00109638:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("IDREFS",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgIDRefsString) {
LAB_001096b5:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00109704;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_001096fb;
      }
LAB_00109704:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_00109992;
      goto LAB_00109715;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::XMLUni::fgIDRefsString;
    if (psVar14 == (short *)0x0) {
LAB_001096af:
      if (*psVar16 == 0) goto LAB_001096b5;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_001096af;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_001096fb:
    tmp = false;
LAB_00109715:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109882:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109882;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109935:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109935;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_00109992:
  if (DTDPresent) {
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("ENTITY",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
    XStr::~XStr(&local_40);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
    if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgEntityString) {
LAB_00109a18:
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
      if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
        psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
        if (psVar14 != (short *)0x0) {
          do {
            sVar3 = *psVar14;
            if (sVar3 == 0) goto LAB_00109a67;
            psVar14 = psVar14 + 1;
            sVar4 = *psVar16;
            psVar16 = psVar16 + 1;
          } while (sVar3 == sVar4);
          goto LAB_00109a5e;
        }
LAB_00109a67:
        tmp = *psVar16 == 0;
        if (tmp) goto LAB_00109cf5;
        goto LAB_00109a78;
      }
      tmp = true;
    }
    else {
      psVar16 = (short *)&xercesc_4_0::XMLUni::fgEntityString;
      if (psVar14 == (short *)0x0) {
LAB_00109a12:
        if (*psVar16 == 0) goto LAB_00109a18;
      }
      else {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00109a12;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
      }
LAB_00109a5e:
      tmp = false;
LAB_00109a78:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\nExpected values : typename \'",0x1d);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
      if (lVar12 == 0) {
        pcVar10 = "(null)";
        sVar11 = 6;
LAB_00109be5:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
      }
      else {
        plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
        pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
        pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        if (pcVar10 != (char *)0x0) {
          sVar11 = strlen(pcVar10);
          goto LAB_00109be5;
        }
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
      if (lVar12 == 0) {
        pcVar10 = "(null)";
        sVar11 = 6;
LAB_00109c98:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
      }
      else {
        plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
        pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
        pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        if (pcVar10 != (char *)0x0) {
          sVar11 = strlen(pcVar10);
          goto LAB_00109c98;
        }
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      uVar17 = 0;
    }
LAB_00109cf5:
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("ENTITIES",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
    XStr::~XStr(&local_40);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
    if (psVar14 == (short *)&xercesc_4_0::XMLUni::fgEntitiesString) {
LAB_00109d72:
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
      if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
        tmp = true;
        goto LAB_0010a04f;
      }
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00109dc1;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_00109db8;
      }
LAB_00109dc1:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010a04f;
    }
    else {
      psVar16 = (short *)&xercesc_4_0::XMLUni::fgEntitiesString;
      if (psVar14 == (short *)0x0) {
LAB_00109d6c:
        if (*psVar16 == 0) goto LAB_00109d72;
      }
      else {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_00109d6c;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
      }
LAB_00109db8:
      tmp = false;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x101);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109f3f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109f3f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00109ff2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00109ff2;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010a04f:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("integer",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER) {
LAB_0010a0cc:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010a11b;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010a112;
      }
LAB_0010a11b:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010a3a9;
      goto LAB_0010a12c;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010a0c6:
      if (*psVar16 == 0) goto LAB_0010a0cc;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010a0c6;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010a112:
    tmp = false;
LAB_0010a12c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010a299:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010a299;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010a34c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010a34c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010a3a9:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("nonPositiveInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER) {
LAB_0010a426:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010a475;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010a46c;
      }
LAB_0010a475:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010a703;
      goto LAB_0010a486;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010a420:
      if (*psVar16 == 0) goto LAB_0010a426;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010a420;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010a46c:
    tmp = false;
LAB_0010a486:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010a5f3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010a5f3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010a6a6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010a6a6;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010a703:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("negativeInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER) {
LAB_0010a780:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010a7cf;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010a7c6;
      }
LAB_0010a7cf:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010aa5d;
      goto LAB_0010a7e0;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010a77a:
      if (*psVar16 == 0) goto LAB_0010a780;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010a77a;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010a7c6:
    tmp = false;
LAB_0010a7e0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010a94d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010a94d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010aa00:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010aa00;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010aa5d:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("long",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_LONG) {
LAB_0010aada:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010ab29;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010ab20;
      }
LAB_0010ab29:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010adb7;
      goto LAB_0010ab3a;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_LONG;
    if (psVar14 == (short *)0x0) {
LAB_0010aad4:
      if (*psVar16 == 0) goto LAB_0010aada;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010aad4;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010ab20:
    tmp = false;
LAB_0010ab3a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010aca7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010aca7;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010ad5a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010ad5a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010adb7:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("int",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INT) {
LAB_0010ae34:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010ae83;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010ae7a;
      }
LAB_0010ae83:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010b111;
      goto LAB_0010ae94;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INT;
    if (psVar14 == (short *)0x0) {
LAB_0010ae2e:
      if (*psVar16 == 0) goto LAB_0010ae34;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010ae2e;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010ae7a:
    tmp = false;
LAB_0010ae94:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b001:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b001;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b0b4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b0b4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010b111:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("short",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT) {
LAB_0010b18e:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010b1dd;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010b1d4;
      }
LAB_0010b1dd:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010b46b;
      goto LAB_0010b1ee;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT;
    if (psVar14 == (short *)0x0) {
LAB_0010b188:
      if (*psVar16 == 0) goto LAB_0010b18e;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010b188;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010b1d4:
    tmp = false;
LAB_0010b1ee:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x114);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b35b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b35b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b40e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b40e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010b46b:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("byte",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE) {
LAB_0010b4e8:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010b537;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010b52e;
      }
LAB_0010b537:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010b7c5;
      goto LAB_0010b548;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE;
    if (psVar14 == (short *)0x0) {
LAB_0010b4e2:
      if (*psVar16 == 0) goto LAB_0010b4e8;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010b4e2;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010b52e:
    tmp = false;
LAB_0010b548:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x117);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b6b5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b6b5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010b768:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010b768;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010b7c5:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("nonNegativeInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER) {
LAB_0010b842:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010b891;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010b888;
      }
LAB_0010b891:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010bb1f;
      goto LAB_0010b8a2;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010b83c:
      if (*psVar16 == 0) goto LAB_0010b842;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010b83c;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010b888:
    tmp = false;
LAB_0010b8a2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010ba0f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010ba0f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010bac2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010bac2;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010bb1f:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedLong",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG) {
LAB_0010bb9c:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010bbeb;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010bbe2;
      }
LAB_0010bbeb:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010be79;
      goto LAB_0010bbfc;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG;
    if (psVar14 == (short *)0x0) {
LAB_0010bb96:
      if (*psVar16 == 0) goto LAB_0010bb9c;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010bb96;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010bbe2:
    tmp = false;
LAB_0010bbfc:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010bd69:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010bd69;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010be1c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010be1c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010be79:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedInt",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_UINT) {
LAB_0010bef6:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010bf45;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010bf3c;
      }
LAB_0010bf45:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010c1d3;
      goto LAB_0010bf56;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_UINT;
    if (psVar14 == (short *)0x0) {
LAB_0010bef0:
      if (*psVar16 == 0) goto LAB_0010bef6;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010bef0;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010bf3c:
    tmp = false;
LAB_0010bf56:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c0c3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c0c3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c176:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c176;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010c1d3:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedShort",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT) {
LAB_0010c250:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010c29f;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010c296;
      }
LAB_0010c29f:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010c52d;
      goto LAB_0010c2b0;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT;
    if (psVar14 == (short *)0x0) {
LAB_0010c24a:
      if (*psVar16 == 0) goto LAB_0010c250;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010c24a;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010c296:
    tmp = false;
LAB_0010c2b0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x123);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c41d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c41d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c4d0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c4d0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010c52d:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedByte",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE) {
LAB_0010c5aa:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010c5f9;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010c5f0;
      }
LAB_0010c5f9:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010c887;
      goto LAB_0010c60a;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE;
    if (psVar14 == (short *)0x0) {
LAB_0010c5a4:
      if (*psVar16 == 0) goto LAB_0010c5aa;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010c5a4;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010c5f0:
    tmp = false;
LAB_0010c60a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c777:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c777;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010c82a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010c82a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010c887:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("positiveInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER) {
LAB_0010c904:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010c953;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010c94a;
      }
LAB_0010c953:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010cbe1;
      goto LAB_0010c964;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010c8fe:
      if (*psVar16 == 0) goto LAB_0010c904;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010c8fe;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010c94a:
    tmp = false;
LAB_0010c964:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010cad1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010cad1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010cb84:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010cb84;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010cbe1:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("defaultString",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING) {
LAB_0010cc5e:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010ccad;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010cca4;
      }
LAB_0010ccad:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010cf3b;
      goto LAB_0010ccbe;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING;
    if (psVar14 == (short *)0x0) {
LAB_0010cc58:
      if (*psVar16 == 0) goto LAB_0010cc5e;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010cc58;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010cca4:
    tmp = false;
LAB_0010ccbe:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x12d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010ce2b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010ce2b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010cede:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010cede;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010cf3b:
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("defaultInt",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER) {
LAB_0010cfb8:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010d007;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010cffe;
      }
LAB_0010d007:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010d295;
      goto LAB_0010d018;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER;
    if (psVar14 == (short *)0x0) {
LAB_0010cfb2:
      if (*psVar16 == 0) goto LAB_0010cfb8;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010cfb2;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010cffe:
    tmp = false;
LAB_0010d018:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x130);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010d185:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010d185;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010d238:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010d238;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010d295:
  pXVar15 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("http://www.w3.org/2000/xmlns/",
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_40.fUnicodeForm = pXVar15;
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prefix",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,pXVar15,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_0010d335:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar14 != (short *)0x0) {
        do {
          sVar3 = *psVar14;
          if (sVar3 == 0) goto LAB_0010d384;
          psVar14 = psVar14 + 1;
          sVar4 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar3 == sVar4);
        goto LAB_0010d37b;
      }
LAB_0010d384:
      tmp = *psVar16 == 0;
      if (tmp) goto LAB_0010d612;
      goto LAB_0010d395;
    }
    tmp = true;
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar14 == (short *)0x0) {
LAB_0010d32f:
      if (*psVar16 == 0) goto LAB_0010d335;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010d32f;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010d37b:
    tmp = false;
LAB_0010d395:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x134);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010d502:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010d502;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0010d5b5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0010d5b5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar17 = 0;
  }
LAB_0010d612:
  pXVar15 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("http://www.w3.org/2001/XMLSchema-instance",
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_40.fUnicodeForm = pXVar15;
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("noNamespaceSchemaLocation",
                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x198))(pDVar5,pXVar15,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar13 + 0x10))(plVar13);
  if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_0010d6b2:
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar13 + 0x18))(plVar13);
    if (psVar14 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
      return (bool)uVar17;
    }
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
    if (psVar14 != (short *)0x0) {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010d701;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
      goto LAB_0010d6f8;
    }
LAB_0010d701:
    tmp = *psVar16 == 0;
    if (tmp) {
      return (bool)uVar17;
    }
  }
  else {
    psVar16 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar14 == (short *)0x0) {
LAB_0010d6ac:
      if (*psVar16 == 0) goto LAB_0010d6b2;
    }
    else {
      do {
        sVar3 = *psVar14;
        if (sVar3 == 0) goto LAB_0010d6ac;
        psVar14 = psVar14 + 1;
        sVar4 = *psVar16;
        psVar16 = psVar16 + 1;
      } while (sVar3 == sVar4);
    }
LAB_0010d6f8:
    tmp = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x137);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nExpected values : typename \'",0x1d);
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
LAB_0010d87f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
  }
  else {
    plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 != (char *)0x0) {
      sVar11 = strlen(pcVar10);
      goto LAB_0010d87f;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
  lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_0010d951;
    }
    sVar11 = strlen(pcVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
LAB_0010d951:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testInBuiltTypesOnAttributes(bool DTDPresent) {

    bool passed = true;
    DOMElement *testEle = findElement(X("attrTest"));

    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrTestType"), X(""), __LINE__);

    DOMAttr *testAttr;

    testAttr = testEle->getAttributeNodeNS(0, X("anySimpleType"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("string"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("boolean"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("decimal"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("float"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("double"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("duration"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("dateTime"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("time"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("date"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYearMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYear"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonthDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("hexBinary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("base64Binary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("anyURI"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("QName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("normalizedString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NORMALIZEDSTRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("token"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TOKEN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("language"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LANGUAGE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKEN"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokenString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKENS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokensString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("Name"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NCName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("ID"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREF"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREFS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefsString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);


    if(DTDPresent) {
        testAttr = testEle->getAttributeNodeNS(0, X("ENTITY"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

        testAttr = testEle->getAttributeNodeNS(0, X("ENTITIES"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntitiesString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    }

    testAttr = testEle->getAttributeNodeNS(0, X("integer"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonPositiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONPOSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("negativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("long"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("int"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("short"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_SHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("byte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonNegativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONNEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedLong"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ULONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UINT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedShort"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_USHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedByte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UBYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("positiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_POSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //couple of defaulted ones
    testAttr = testEle->getAttributeNodeNS(0, X("defaultString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("defaultInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //ns attr
    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2000/xmlns/"), X("prefix"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2001/XMLSchema-instance"), X("noNamespaceSchemaLocation"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;
}